

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void deserialize_node<std::istream,short,unsigned_int>
               (ImputeNode *node,basic_istream<char,_std::char_traits<char>_> *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  pointer pvVar1;
  vector<double,_std::allocator<double>_> *v;
  pointer vec;
  size_t veclen;
  size_t data_sizets [5];
  
  if (!interrupt_switch) {
    read_bytes<unsigned_long,unsigned_int>(data_sizets,5,in,buffer,diff_endian);
    node->parent = data_sizets[0];
    read_bytes<double,double>(&node->num_sum,data_sizets[1],in,buffer,diff_endian);
    read_bytes<double,double>(&node->num_weight,data_sizets[2],in,buffer,diff_endian);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&node->cat_sum,data_sizets[3]);
    if (data_sizets[3] != 0) {
      pvVar1 = (node->cat_sum).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (vec = (node->cat_sum).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; vec != pvVar1; vec = vec + 1) {
        read_bytes<unsigned_long,unsigned_int>(&veclen,1,in,buffer,diff_endian);
        read_bytes<double,double>(vec,veclen,in,buffer,diff_endian);
      }
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::_M_shrink_to_fit(&node->cat_sum);
    read_bytes<double,double>(&node->cat_weight,data_sizets[4],in,buffer,diff_endian);
  }
  return;
}

Assistant:

void deserialize_node(ImputeNode &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    size_t data_sizets[5];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)5, in, buffer, diff_endian);
    node.parent = data_sizets[0];

    read_bytes<double, double>(node.num_sum, data_sizets[1], in, buffer, diff_endian);

    read_bytes<double, double>(node.num_weight, data_sizets[2], in, buffer, diff_endian);

    node.cat_sum.resize(data_sizets[3]);
    if (data_sizets[3]) {
        size_t veclen;
        for (auto &v : node.cat_sum) {
            read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
            read_bytes<double, double>(v, veclen, in, buffer, diff_endian);
        }
    }
    node.cat_sum.shrink_to_fit();

    read_bytes<double, double>(node.cat_weight, data_sizets[4], in, buffer, diff_endian);
}